

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void __thiscall MidiInApi::MidiInApi(MidiInApi *this,uint queueSizeLimit)

{
  ulong *puVar1;
  long lVar2;
  MidiMessage *this_00;
  long lVar3;
  
  MidiApi::MidiApi(&this->super_MidiApi);
  (this->super_MidiApi)._vptr_MidiApi = (_func_int **)&PTR__MidiInApi_00111a98;
  RtMidiInData::RtMidiInData(&this->inputData_);
  (this->inputData_).queue.ringSize = queueSizeLimit;
  if (queueSizeLimit != 0) {
    lVar2 = (ulong)queueSizeLimit * 0x20;
    puVar1 = (ulong *)operator_new__(lVar2 + 8);
    *puVar1 = (ulong)queueSizeLimit;
    lVar3 = 0;
    this_00 = (MidiMessage *)(puVar1 + 1);
    do {
      MidiMessage::MidiMessage(this_00);
      lVar3 = lVar3 + -0x20;
      this_00 = this_00 + 1;
    } while (-lVar3 != lVar2);
    (this->inputData_).queue.ring = (MidiMessage *)(puVar1 + 1);
  }
  return;
}

Assistant:

MidiInApi :: MidiInApi( unsigned int queueSizeLimit )
  : MidiApi()
{
  // Allocate the MIDI queue.
  inputData_.queue.ringSize = queueSizeLimit;
  if ( inputData_.queue.ringSize > 0 )
    inputData_.queue.ring = new MidiMessage[ inputData_.queue.ringSize ];
}